

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall
bpwriter::format_with_padding(bpwriter *this,char *str,size_t bytes,size_t chars,fmtopts *opts)

{
  bpwriter *this_00;
  long in_RCX;
  char *in_RSI;
  bpwriter *in_RDI;
  long in_R8;
  int npad;
  int in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  
  if ((int)in_RCX < *(int *)(in_R8 + 8)) {
    this_00 = (bpwriter *)(*(int *)(in_R8 + 8) - in_RCX);
  }
  else {
    this_00 = (bpwriter *)0x0;
  }
  if (*(int *)(in_R8 + 0x10) == 0) {
    putwch(this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  }
  puts(in_RDI,in_RSI);
  if (*(int *)(in_R8 + 0x10) != 0) {
    putwch(this_00,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void format_with_padding(VMG_ const char *str,
                             size_t bytes, size_t chars,
                             const fmtopts &opts)
    {
        /* 
         *   Figure the amount of padding: if the width is larger than the
         *   string length (in characters), pad by the difference.  
         */
        int npad = (opts.width > (int)chars ? opts.width - chars : 0);

        /* if right-aligning, write the padding */
        if (!opts.left_align)
            putwch(opts.pad, npad);

        /* write the string */
        puts(str, bytes);

        /* if left-aligning, write the padding */
        if (opts.left_align)
            putwch(opts.pad, npad);
    }